

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Aabb.cpp
# Opt level: O3

bool __thiscall AABB::Intersect(AABB *this,Ray *ray,float t_min,float t_max)

{
  ulong uVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined8 local_20;
  float local_18;
  undefined8 local_10;
  float local_8;
  
  local_10 = *(undefined8 *)(ray->m_origin).e;
  local_8 = (ray->m_origin).e[2];
  uVar1 = 0;
  bVar2 = false;
  while( true ) {
    local_20 = *(undefined8 *)(ray->m_direction).e;
    local_18 = (ray->m_direction).e[2];
    fVar3 = 1.0 / *(float *)((long)&local_20 + uVar1 * 4);
    local_20 = *(undefined8 *)(this->m_min).e;
    local_18 = (this->m_min).e[2];
    fVar4 = (*(float *)((long)&local_20 + uVar1 * 4) - *(float *)((long)&local_10 + uVar1 * 4)) *
            fVar3;
    local_20 = *(undefined8 *)(this->m_max).e;
    local_18 = (this->m_max).e[2];
    fVar5 = (*(float *)((long)&local_20 + uVar1 * 4) - *(float *)((long)&local_10 + uVar1 * 4)) *
            fVar3;
    fVar6 = fVar5;
    if (0.0 <= fVar3) {
      fVar6 = fVar4;
    }
    if (t_min <= fVar6) {
      t_min = fVar6;
    }
    fVar6 = (float)(~-(uint)(fVar3 < 0.0) & (uint)fVar5 | (uint)fVar4 & -(uint)(fVar3 < 0.0));
    if (fVar6 <= t_max) {
      t_max = fVar6;
    }
    if (t_max <= t_min) break;
    bVar2 = 1 < uVar1;
    uVar1 = uVar1 + 1;
    if (uVar1 == 3) {
      return bVar2;
    }
  }
  return bVar2;
}

Assistant:

bool
AABB::Intersect(const Ray& ray, float t_min, float t_max) const
{

// for all axis (x,y,z)
    for(int i=0; i<3; ++i) {
        
// compute t0,t1 overlap intervals
        float _inv_d = 1.0f / ray.GetDirection()[i];
        float _t_min = (GetMin()[i] - ray.GetOrigin()[i]) * _inv_d;
        float _t_max = (GetMax()[i] - ray.GetOrigin()[i]) * _inv_d;
        
        if(_inv_d < 0.0f) {
            std::swap(_t_min, _t_max);
        }

        t_min = std::max(_t_min, t_min);
        t_max = std::min(_t_max, t_max);

// no collision in this axis
        if(t_max <= t_min) {
            return false;
        }
    }

// we have overlap on all axes
    return true;
}